

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateFastInlineIsArray(Lowerer *this,Instr *instr)

{
  Instr *argoutInlineSpecialized;
  Func *pFVar1;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  IRType type;
  uint32 uVar5;
  undefined4 *puVar6;
  Opnd *dst_00;
  Opnd *pOVar7;
  SymOpnd *pSVar8;
  StackSym *pSVar9;
  LabelInstr *target;
  RegOpnd *baseOpnd;
  LabelInstr *target_00;
  LabelInstr *labelTarget;
  IndirOpnd *pIVar10;
  IntConstOpnd *pIVar11;
  undefined1 local_e0 [8];
  AutoReuseOpnd autoReuseTypeIdOpnd;
  RegOpnd *typeIdOpnd;
  IndirOpnd *indirOpnd;
  AutoReuseOpnd autoReuseTypeOpnd;
  RegOpnd *typeOpnd;
  LabelInstr *notArrayLabel;
  LabelInstr *checkNotArrayLabel;
  RegOpnd *src;
  LabelInstr *pLStack_68;
  ValueType valueType;
  LabelInstr *doneLabel;
  Instr *insertInstr;
  LabelInstr *helperLabel;
  bool result;
  Opnd *argsOpnd [2];
  Instr *tmpInstr;
  Opnd *linkOpnd;
  Opnd *dst;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4eb2,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  dst_00 = IR::Instr::GetDst(instr);
  if (dst_00 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4eb5,"(dst)","dst");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pOVar7 = IR::Instr::GetSrc2(instr);
  pSVar8 = IR::Opnd::AsSymOpnd(pOVar7);
  pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
  argoutInlineSpecialized = (pSVar9->field_5).m_instrDef;
  memset(&stack0xffffffffffffffb8,0,0x10);
  bVar4 = IR::Instr::FetchOperands(instr,(Opnd **)&stack0xffffffffffffffb8,2);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4ebe,"(result)","result");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (argsOpnd[0] == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4ebf,"(argsOpnd[1])","argsOpnd[1]");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  target = InsertLabel(true,instr);
  pLStack_68 = InsertLabel(false,instr->m_next);
  src._6_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
              IR::Opnd::GetValueType(argsOpnd[0]);
  pFVar1 = this->m_func;
  type = IR::Opnd::GetType(argsOpnd[0]);
  baseOpnd = GetRegOpnd(this,argsOpnd[0],&target->super_Instr,pFVar1,type);
  pFVar1 = this->m_func;
  bVar4 = ValueType::IsLikelyArray((ValueType *)((long)&src + 6));
  target_00 = IR::LabelInstr::New(Label,pFVar1,bVar4);
  pFVar1 = this->m_func;
  bVar4 = ValueType::IsLikelyArray((ValueType *)((long)&src + 6));
  labelTarget = IR::LabelInstr::New(Label,pFVar1,bVar4);
  bVar4 = IR::Opnd::IsNotTaggedValue(&baseOpnd->super_Opnd);
  if (!bVar4) {
    LowererMD::GenerateObjectTest
              (&this->m_lowererMD,&baseOpnd->super_Opnd,&target->super_Instr,labelTarget,false);
  }
  autoReuseTypeOpnd._16_8_ = IR::RegOpnd::New(TyUint64,this->m_func);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&indirOpnd,(Opnd *)autoReuseTypeOpnd._16_8_,this->m_func,true);
  uVar5 = Js::RecyclableObject::GetOffsetOfType();
  pIVar10 = IR::IndirOpnd::New(baseOpnd,uVar5,TyUint64,this->m_func,false);
  InsertMove((Opnd *)autoReuseTypeOpnd._16_8_,&pIVar10->super_Opnd,&target->super_Instr,true);
  autoReuseTypeIdOpnd._16_8_ = IR::RegOpnd::New(TyUint64,this->m_func);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)local_e0,(Opnd *)autoReuseTypeIdOpnd._16_8_,this->m_func,true);
  uVar3 = autoReuseTypeOpnd._16_8_;
  uVar5 = Js::Type::GetOffsetOfTypeId();
  pIVar10 = IR::IndirOpnd::New((RegOpnd *)uVar3,uVar5,TyInt32,this->m_func,false);
  InsertMove((Opnd *)autoReuseTypeIdOpnd._16_8_,&pIVar10->super_Opnd,&target->super_Instr,true);
  uVar3 = autoReuseTypeIdOpnd._16_8_;
  pIVar11 = IR::IntConstOpnd::New(0x1d,TyInt32,this->m_func,false);
  InsertCompareBranch(this,(Opnd *)uVar3,&pIVar11->super_Opnd,BrLt_A,target_00,&target->super_Instr,
                      false);
  uVar3 = autoReuseTypeIdOpnd._16_8_;
  pIVar11 = IR::IntConstOpnd::New(0x21,TyInt32,this->m_func,false);
  InsertCompareBranch(this,(Opnd *)uVar3,&pIVar11->super_Opnd,BrGt_A,labelTarget,
                      &target->super_Instr,false);
  pOVar7 = LoadLibraryValueOpnd(this,instr,ValueTrue);
  InsertMove(dst_00,pOVar7,&target->super_Instr,true);
  InsertBranch(Br,pLStack_68,&target->super_Instr);
  IR::Instr::InsertBefore(&target->super_Instr,&target_00->super_Instr);
  uVar3 = autoReuseTypeIdOpnd._16_8_;
  pIVar11 = IR::IntConstOpnd::New(0x1a,TyInt32,this->m_func,false);
  InsertCompareBranch(this,(Opnd *)uVar3,&pIVar11->super_Opnd,BrEq_A,target,&target->super_Instr,
                      false);
  uVar3 = autoReuseTypeIdOpnd._16_8_;
  pIVar11 = IR::IntConstOpnd::New(0x17,TyInt32,this->m_func,false);
  InsertCompareBranch(this,(Opnd *)uVar3,&pIVar11->super_Opnd,BrEq_A,target,&target->super_Instr,
                      false);
  IR::Instr::InsertBefore(&target->super_Instr,&labelTarget->super_Instr);
  pOVar7 = LoadLibraryValueOpnd(this,instr,ValueFalse);
  InsertMove(dst_00,pOVar7,&target->super_Instr,true);
  InsertBranch(Br,pLStack_68,&target->super_Instr);
  RelocateCallDirectToHelperPath(this,argoutInlineSpecialized,target);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_e0);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&indirOpnd);
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineIsArray(IR::Instr * instr)
{
    Assert(instr->m_opcode == Js::OpCode::CallDirect);

    IR::Opnd * dst = instr->GetDst();
    Assert(dst);

    //CallDirect src2
    IR::Opnd * linkOpnd = instr->GetSrc2();
    //ArgOut_A_InlineSpecialized
    IR::Instr * tmpInstr = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;

    IR::Opnd * argsOpnd[2] = { 0 };
    bool result = instr->FetchOperands(argsOpnd, 2);
    Assert(result);
    AnalysisAssert(argsOpnd[1]);

    IR::LabelInstr *helperLabel = InsertLabel(true, instr);
    IR::Instr * insertInstr = helperLabel;
    IR::LabelInstr *doneLabel = InsertLabel(false, instr->m_next);

    ValueType valueType = argsOpnd[1]->GetValueType();
    IR::RegOpnd * src = GetRegOpnd(argsOpnd[1], insertInstr, m_func, argsOpnd[1]->GetType());

    IR::LabelInstr *checkNotArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, valueType.IsLikelyArray());
    IR::LabelInstr *notArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, valueType.IsLikelyArray());

    if (!src->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(src, insertInstr, notArrayLabel);
    }

    //  MOV typeOpnd, [opnd + offset(type)]
    IR::RegOpnd *typeOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    const IR::AutoReuseOpnd autoReuseTypeOpnd(typeOpnd, m_func);
    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(src, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, m_func);
    InsertMove(typeOpnd, indirOpnd, insertInstr);

    //  MOV typeIdOpnd, [typeOpnd + offset(typeId)]
    IR::RegOpnd *typeIdOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    const IR::AutoReuseOpnd autoReuseTypeIdOpnd(typeIdOpnd, m_func);
    indirOpnd = IR::IndirOpnd::New(typeOpnd, Js::Type::GetOffsetOfTypeId(), TyInt32, m_func);
    InsertMove(typeIdOpnd, indirOpnd, insertInstr);

    //  CMP typeIdOpnd, TypeIds_ArrayFirst
    //  JLT $notArray
    InsertCompareBranch(
        typeIdOpnd,
        IR::IntConstOpnd::New(Js::TypeIds_ArrayFirst, TyInt32, m_func),
        Js::OpCode::BrLt_A,
        checkNotArrayLabel,
        insertInstr);
    //  CMP typeIdOpnd, TypeIds_ArrayLastWithES5
    //  JGT $notArray
    InsertCompareBranch(
        typeIdOpnd,
        IR::IntConstOpnd::New(Js::TypeIds_ArrayLastWithES5, TyInt32, m_func),
        Js::OpCode::BrGt_A,
        notArrayLabel,
        insertInstr);

    // MOV dst, True
    InsertMove(dst, LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), insertInstr);

    // JMP $done
    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    // $checkNotArray:
    insertInstr->InsertBefore(checkNotArrayLabel);

    //  CMP typeIdOpnd, TypeIds_Proxy
    //  JEQ $helperLabel
    InsertCompareBranch(
        typeIdOpnd,
        IR::IntConstOpnd::New(Js::TypeIds_Proxy, TyInt32, m_func),
        Js::OpCode::BrEq_A,
        helperLabel,
        insertInstr);
    CompileAssert(Js::TypeIds_Proxy < Js::TypeIds_ArrayFirst);

    //  CMP typeIdOpnd, TypeIds_HostDispatch
    //  JEQ $helperLabel
    InsertCompareBranch(
        typeIdOpnd,
        IR::IntConstOpnd::New(Js::TypeIds_HostDispatch, TyInt32, m_func),
        Js::OpCode::BrEq_A,
        helperLabel,
        insertInstr);
    CompileAssert(Js::TypeIds_HostDispatch < Js::TypeIds_ArrayFirst);

    // $notObjectLabel:
    insertInstr->InsertBefore(notArrayLabel);

    // MOV dst, False
    InsertMove(dst, LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), insertInstr);

    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    RelocateCallDirectToHelperPath(tmpInstr, helperLabel);
}